

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

bool __thiscall
duckdb::RowGroupCollection::Scan
          (RowGroupCollection *this,DuckTransaction *transaction,
          vector<duckdb::StorageIndex,_true> *column_ids,function<bool_(duckdb::DataChunk_&)> *fun)

{
  idx_t iVar1;
  bool bVar2;
  const_reference pvVar3;
  reference __x;
  DataTableInfo *pDVar4;
  Allocator *allocator;
  optional_ptr<duckdb::TableFilterSet,_true> table_filters;
  vector<duckdb::StorageIndex,_true> *column_ids_00;
  size_type __n;
  vector<duckdb::LogicalType,_true> scan_types;
  DataChunk chunk;
  TableScanState state;
  vector<duckdb::LogicalType,_true> local_278;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_258;
  DataChunk local_240;
  TableScanState local_200;
  
  local_278.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_278.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_278.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>).
      super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    do {
      pvVar3 = vector<duckdb::StorageIndex,_true>::operator[](column_ids,__n);
      __x = vector<duckdb::LogicalType,_true>::operator[](&this->types,pvVar3->index);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_278,__x
                );
      __n = __n + 1;
    } while (__n < (ulong)((long)(column_ids->
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ).
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(column_ids->
                                 super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ).
                                 super__Vector_base<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  DataChunk::DataChunk(&local_240);
  pDVar4 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&this->info);
  allocator = Allocator::Get(pDVar4->db);
  DataChunk::Initialize(&local_240,allocator,&local_278,0x800);
  TableScanState::TableScanState(&local_200);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            (&local_258,
             &column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>)
  ;
  table_filters.ptr = (TableFilterSet *)0x0;
  TableScanState::Initialize
            (&local_200,(vector<duckdb::StorageIndex,_true> *)&local_258,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_258);
  InitializeScan(this,&local_200.local_state,column_ids_00,table_filters);
  do {
    DataChunk::Reset(&local_240);
    CollectionScanState::Scan(&local_200.local_state,transaction,&local_240);
    iVar1 = local_240.count;
    if (local_240.count == 0) break;
    if ((fun->super__Function_base)._M_manager == (_Manager_type)0x0) {
      ::std::__throw_bad_function_call();
    }
    bVar2 = (*fun->_M_invoker)((_Any_data *)fun,&local_240);
  } while (bVar2);
  TableScanState::~TableScanState(&local_200);
  DataChunk::~DataChunk(&local_240);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_278);
  return iVar1 == 0;
}

Assistant:

bool RowGroupCollection::Scan(DuckTransaction &transaction, const vector<StorageIndex> &column_ids,
                              const std::function<bool(DataChunk &chunk)> &fun) {
	vector<LogicalType> scan_types;
	for (idx_t i = 0; i < column_ids.size(); i++) {
		scan_types.push_back(types[column_ids[i].GetPrimaryIndex()]);
	}
	DataChunk chunk;
	chunk.Initialize(GetAllocator(), scan_types);

	// initialize the scan
	TableScanState state;
	state.Initialize(column_ids, nullptr);
	InitializeScan(state.local_state, column_ids, nullptr);

	while (true) {
		chunk.Reset();
		state.local_state.Scan(transaction, chunk);
		if (chunk.size() == 0) {
			return true;
		}
		if (!fun(chunk)) {
			return false;
		}
	}
}